

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall gl4cts::GLSL420Pack::InitializerListTest::logTestCaseName(InitializerListTest *this)

{
  ostringstream *this_00;
  int iVar1;
  pointer ptVar2;
  MessageBuilder *this_01;
  TestError *this_02;
  char *pcVar3;
  MessageBuilder message;
  
  this_01 = &message;
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  message.m_log =
       ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
  this_00 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
    pcVar3 = "List. Single vec";
    goto LAB_00a71d0d;
  case MATRIX:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"List. Single mat")
    ;
    this_01 = tcu::MessageBuilder::operator<<(&message,&ptVar2[iVar1].m_n_cols);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
    goto LAB_00a71d18;
  case MATRIX_ROWS:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Ctr. Single mat");
    this_01 = tcu::MessageBuilder::operator<<(&message,&ptVar2[iVar1].m_n_cols);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
    goto LAB_00a71d18;
  case STRUCT:
    pcVar3 = "List. Structure";
    break;
  case ARRAY_SCALAR:
    pcVar3 = "List. Array of scalars";
    break;
  case ARRAY_VECTOR_CTR:
    pcVar3 = "Ctr. Array of vec";
    goto LAB_00a71d0d;
  case ARRAY_VECTOR_LIST:
    pcVar3 = "List. Array of vec";
    goto LAB_00a71d0d;
  case ARRAY_MATRIX_CTR:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Ctr. Array of mat"
                   );
    this_01 = tcu::MessageBuilder::operator<<(&message,&ptVar2[iVar1].m_n_cols);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
    goto LAB_00a71d18;
  case ARRAY_MATRIX_LIST:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "List. Array of mat");
    this_01 = tcu::MessageBuilder::operator<<(&message,&ptVar2[iVar1].m_n_cols);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
    goto LAB_00a71d18;
  case ARRAY_STRUCT:
    pcVar3 = "List. Array of structures";
    break;
  case NESTED_STRUCT_CTR:
    pcVar3 = "Ctr. Nested structure";
    break;
  case NESTED_STRUCT_LIST:
    pcVar3 = "List. Nested structure";
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
    pcVar3 = "List. Structure with structure array";
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    pcVar3 = "Mix. Structure with structure array";
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
    pcVar3 = "List. Array of structures with structures";
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    pcVar3 = "Mix. Array of structures with structures";
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
    pcVar3 = "List. Structure with structure with array";
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    pcVar3 = "Mix. Structure with structure with array";
    break;
  case UNSIZED_ARRAY_SCALAR:
    pcVar3 = "List. Unsized array of scalars";
    break;
  case UNSIZED_ARRAY_VECTOR:
    pcVar3 = "List. Unsized array of vec";
LAB_00a71d0d:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
    goto LAB_00a71d18;
  case UNSIZED_ARRAY_MATRIX:
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "List. Unsized array of mat");
    this_01 = tcu::MessageBuilder::operator<<(&message,&ptVar2[iVar1].m_n_cols);
    std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
LAB_00a71d18:
    tcu::MessageBuilder::operator<<(this_01,&ptVar2[iVar1].m_n_rows);
    goto LAB_00a71d27;
  case UNSIZED_ARRAY_STRUCT:
    pcVar3 = "List. Unsized array of structures";
    break;
  default:
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3776);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
LAB_00a71d27:
  tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void InitializerListTest::logTestCaseName()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		message << "List. Single vec" << test_case.m_n_rows;
		break;
	case MATRIX:
		message << "List. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case MATRIX_ROWS:
		message << "Ctr. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case STRUCT:
		message << "List. Structure";
		break;
	case NESTED_STRUCT_CTR:
		message << "Ctr. Nested structure";
		break;
	case NESTED_STRUCT_LIST:
		message << "List. Nested structure";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		message << "List. Structure with structure array";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		message << "Mix. Structure with structure array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		message << "List. Structure with structure with array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		message << "Mix. Structure with structure with array";
		break;
	case ARRAY_SCALAR:
		message << "List. Array of scalars";
		break;
	case ARRAY_VECTOR_CTR:
		message << "Ctr. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_VECTOR_LIST:
		message << "List. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_CTR:
		message << "Ctr. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_LIST:
		message << "List. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_STRUCT:
		message << "List. Array of structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		message << "List. Array of structures with structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		message << "Mix. Array of structures with structures";
		break;
	case UNSIZED_ARRAY_SCALAR:
		message << "List. Unsized array of scalars";
		break;
	case UNSIZED_ARRAY_VECTOR:
		message << "List. Unsized array of vec" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_MATRIX:
		message << "List. Unsized array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_STRUCT:
		message << "List. Unsized array of structures";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	message << tcu::TestLog::EndMessage;
}